

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O0

unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_>
anon_unknown.dwarf_26820::create_dic(string *dic_type)

{
  bool bVar1;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  _Head_base<0UL,_ddd::Dictionary_*,_false> __u;
  unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *in_stack_ffffffffffffffb0;
  
  __u._M_head_impl = (Dictionary *)in_RDI;
  bVar1 = std::operator==(in_RDI,in_RSI);
  if (bVar1) {
    ddd::make_unique<ddd::DictionarySGL<false,false>>();
    std::unique_ptr<ddd::Dictionary,std::default_delete<ddd::Dictionary>>::
    unique_ptr<ddd::DictionarySGL<false,false>,std::default_delete<ddd::DictionarySGL<false,false>>,void>
              (in_stack_ffffffffffffffb0,
               (unique_ptr<ddd::DictionarySGL<false,_false>,_std::default_delete<ddd::DictionarySGL<false,_false>_>_>
                *)__u._M_head_impl);
    std::
    unique_ptr<ddd::DictionarySGL<false,_false>,_std::default_delete<ddd::DictionarySGL<false,_false>_>_>
    ::~unique_ptr((unique_ptr<ddd::DictionarySGL<false,_false>,_std::default_delete<ddd::DictionarySGL<false,_false>_>_>
                   *)in_RDI);
  }
  else {
    bVar1 = std::operator==(in_RDI,in_RSI);
    if (bVar1) {
      ddd::make_unique<ddd::DictionarySGL<false,true>>();
      std::unique_ptr<ddd::Dictionary,std::default_delete<ddd::Dictionary>>::
      unique_ptr<ddd::DictionarySGL<false,true>,std::default_delete<ddd::DictionarySGL<false,true>>,void>
                (in_stack_ffffffffffffffb0,
                 (unique_ptr<ddd::DictionarySGL<false,_true>,_std::default_delete<ddd::DictionarySGL<false,_true>_>_>
                  *)__u._M_head_impl);
      std::
      unique_ptr<ddd::DictionarySGL<false,_true>,_std::default_delete<ddd::DictionarySGL<false,_true>_>_>
      ::~unique_ptr((unique_ptr<ddd::DictionarySGL<false,_true>,_std::default_delete<ddd::DictionarySGL<false,_true>_>_>
                     *)in_RDI);
    }
    else {
      bVar1 = std::operator==(in_RDI,in_RSI);
      if (bVar1) {
        ddd::make_unique<ddd::DictionarySGL<true,false>>();
        std::unique_ptr<ddd::Dictionary,std::default_delete<ddd::Dictionary>>::
        unique_ptr<ddd::DictionarySGL<true,false>,std::default_delete<ddd::DictionarySGL<true,false>>,void>
                  (in_stack_ffffffffffffffb0,
                   (unique_ptr<ddd::DictionarySGL<true,_false>,_std::default_delete<ddd::DictionarySGL<true,_false>_>_>
                    *)__u._M_head_impl);
        std::
        unique_ptr<ddd::DictionarySGL<true,_false>,_std::default_delete<ddd::DictionarySGL<true,_false>_>_>
        ::~unique_ptr((unique_ptr<ddd::DictionarySGL<true,_false>,_std::default_delete<ddd::DictionarySGL<true,_false>_>_>
                       *)in_RDI);
      }
      else {
        bVar1 = std::operator==(in_RDI,in_RSI);
        if (bVar1) {
          ddd::make_unique<ddd::DictionarySGL<true,true>>();
          std::unique_ptr<ddd::Dictionary,std::default_delete<ddd::Dictionary>>::
          unique_ptr<ddd::DictionarySGL<true,true>,std::default_delete<ddd::DictionarySGL<true,true>>,void>
                    (in_stack_ffffffffffffffb0,
                     (unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
                      *)__u._M_head_impl);
          std::
          unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
          ::~unique_ptr((unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
                         *)in_RDI);
        }
        else {
          bVar1 = std::operator==(in_RDI,in_RSI);
          if (bVar1) {
            ddd::make_unique<ddd::DictionaryMLT<false,false>>();
            std::unique_ptr<ddd::Dictionary,std::default_delete<ddd::Dictionary>>::
            unique_ptr<ddd::DictionaryMLT<false,false>,std::default_delete<ddd::DictionaryMLT<false,false>>,void>
                      (in_stack_ffffffffffffffb0,
                       (unique_ptr<ddd::DictionaryMLT<false,_false>,_std::default_delete<ddd::DictionaryMLT<false,_false>_>_>
                        *)__u._M_head_impl);
            std::
            unique_ptr<ddd::DictionaryMLT<false,_false>,_std::default_delete<ddd::DictionaryMLT<false,_false>_>_>
            ::~unique_ptr((unique_ptr<ddd::DictionaryMLT<false,_false>,_std::default_delete<ddd::DictionaryMLT<false,_false>_>_>
                           *)in_RDI);
          }
          else {
            bVar1 = std::operator==(in_RDI,in_RSI);
            if (bVar1) {
              ddd::make_unique<ddd::DictionaryMLT<false,true>>();
              std::unique_ptr<ddd::Dictionary,std::default_delete<ddd::Dictionary>>::
              unique_ptr<ddd::DictionaryMLT<false,true>,std::default_delete<ddd::DictionaryMLT<false,true>>,void>
                        (in_stack_ffffffffffffffb0,
                         (unique_ptr<ddd::DictionaryMLT<false,_true>,_std::default_delete<ddd::DictionaryMLT<false,_true>_>_>
                          *)__u._M_head_impl);
              std::
              unique_ptr<ddd::DictionaryMLT<false,_true>,_std::default_delete<ddd::DictionaryMLT<false,_true>_>_>
              ::~unique_ptr((unique_ptr<ddd::DictionaryMLT<false,_true>,_std::default_delete<ddd::DictionaryMLT<false,_true>_>_>
                             *)in_RDI);
            }
            else {
              bVar1 = std::operator==(in_RDI,in_RSI);
              if (bVar1) {
                ddd::make_unique<ddd::DictionaryMLT<true,false>>();
                std::unique_ptr<ddd::Dictionary,std::default_delete<ddd::Dictionary>>::
                unique_ptr<ddd::DictionaryMLT<true,false>,std::default_delete<ddd::DictionaryMLT<true,false>>,void>
                          (in_stack_ffffffffffffffb0,
                           (unique_ptr<ddd::DictionaryMLT<true,_false>,_std::default_delete<ddd::DictionaryMLT<true,_false>_>_>
                            *)__u._M_head_impl);
                std::
                unique_ptr<ddd::DictionaryMLT<true,_false>,_std::default_delete<ddd::DictionaryMLT<true,_false>_>_>
                ::~unique_ptr((unique_ptr<ddd::DictionaryMLT<true,_false>,_std::default_delete<ddd::DictionaryMLT<true,_false>_>_>
                               *)in_RDI);
              }
              else {
                bVar1 = std::operator==(in_RDI,in_RSI);
                if (bVar1) {
                  ddd::make_unique<ddd::DictionaryMLT<true,true>>();
                  std::unique_ptr<ddd::Dictionary,std::default_delete<ddd::Dictionary>>::
                  unique_ptr<ddd::DictionaryMLT<true,true>,std::default_delete<ddd::DictionaryMLT<true,true>>,void>
                            (in_stack_ffffffffffffffb0,
                             (unique_ptr<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                              *)__u._M_head_impl);
                  std::
                  unique_ptr<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                  ::~unique_ptr((unique_ptr<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                                 *)in_RDI);
                }
                else {
                  std::unique_ptr<ddd::Dictionary,std::default_delete<ddd::Dictionary>>::
                  unique_ptr<std::default_delete<ddd::Dictionary>,void>
                            ((unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)
                             in_RDI,in_RSI);
                }
              }
            }
          }
        }
      }
    }
  }
  return (__uniq_ptr_data<ddd::Dictionary,_std::default_delete<ddd::Dictionary>,_true,_true>)
         (tuple<ddd::Dictionary_*,_std::default_delete<ddd::Dictionary>_>)__u._M_head_impl;
}

Assistant:

std::unique_ptr<Dictionary> create_dic(const std::string dic_type) {
  if (dic_type == "SGL") {
    return make_unique<DictionarySGL<false, false>>();
  } else if (dic_type == "SGL_NL") {
    return make_unique<DictionarySGL<false, true>>();
  } else if (dic_type == "SGL_BL") {
    return make_unique<DictionarySGL<true, false>>();
  } else if (dic_type == "SGL_NL_BL") {
    return make_unique<DictionarySGL<true, true>>();
  } else if (dic_type == "MLT") {
    return make_unique<DictionaryMLT<false, false>>();
  } else if (dic_type == "MLT_NL") {
    return make_unique<DictionaryMLT<false, true>>();
  } else if (dic_type == "MLT_BL") {
    return make_unique<DictionaryMLT<true, false>>();
  } else if (dic_type == "MLT_NL_BL") {
    return make_unique<DictionaryMLT<true, true>>();
  }
  return nullptr;
}